

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverBB.cpp
# Opt level: O1

void __thiscall chrono::ChSolverBB::ArchiveOUT(ChSolverBB *this,ChArchiveOut *marchive)

{
  char *local_38;
  bool *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChSolverBB>(marchive);
  ChIterativeSolverVI::ArchiveOUT(&this->super_ChIterativeSolverVI,marchive);
  local_30 = (bool *)&this->n_armijo;
  local_38 = "n_armijo";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive,&local_38);
  local_30 = (bool *)&this->max_armijo_backtrace;
  local_38 = "max_armijo_backtrace";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive,&local_38);
  local_30 = &(this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_use_precond;
  local_38 = "m_use_precond";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  return;
}

Assistant:

void ChSolverBB::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChSolverBB>();
    // serialize parent class
    ChIterativeSolverVI::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(n_armijo);
    marchive << CHNVP(max_armijo_backtrace);
    marchive << CHNVP(m_use_precond);
}